

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_sign.c
# Opt level: O0

uchar * ossl_rsa_digestinfo_encoding(int md_nid,size_t *len)

{
  size_t *len_local;
  int md_nid_local;
  uchar *local_8;
  
  if (md_nid == 4) {
    *len = 0x12;
    local_8 = digestinfo_md5_der;
  }
  else if (md_nid == 0x40) {
    *len = 0xf;
    local_8 = "0!0\t\x06\x05+\x0e\x03\x02\x1a\x05";
  }
  else if (md_nid == 0x5f) {
    *len = 0xe;
    local_8 = "0\x1c0\b\x06\x04U\b\x03e\x05";
  }
  else if (md_nid == 0x75) {
    *len = 0xf;
    local_8 = "0!0\t\x06\x05+$\x03\x02\x01\x05";
  }
  else if (md_nid == 0x101) {
    *len = 0x12;
    local_8 = digestinfo_md4_der;
  }
  else if (md_nid == 0x2a0) {
    *len = 0x13;
    local_8 = digestinfo_sha256_der;
  }
  else if (md_nid == 0x2a1) {
    *len = 0x13;
    local_8 = digestinfo_sha384_der;
  }
  else if (md_nid == 0x2a2) {
    *len = 0x13;
    local_8 = digestinfo_sha512_der;
  }
  else if (md_nid == 0x2a3) {
    *len = 0x13;
    local_8 = digestinfo_sha224_der;
  }
  else if (md_nid == 0x446) {
    *len = 0x13;
    local_8 = digestinfo_sha512_224_der;
  }
  else if (md_nid == 0x447) {
    *len = 0x13;
    local_8 = digestinfo_sha512_256_der;
  }
  else if (md_nid == 0x448) {
    *len = 0x13;
    local_8 = digestinfo_sha3_224_der;
  }
  else if (md_nid == 0x449) {
    *len = 0x13;
    local_8 = digestinfo_sha3_256_der;
  }
  else if (md_nid == 0x44a) {
    *len = 0x13;
    local_8 = digestinfo_sha3_384_der;
  }
  else if (md_nid == 1099) {
    *len = 0x13;
    local_8 = digestinfo_sha3_512_der;
  }
  else {
    local_8 = (uchar *)0x0;
  }
  return local_8;
}

Assistant:

const unsigned char *ossl_rsa_digestinfo_encoding(int md_nid, size_t *len)
{
    switch (md_nid) {
#ifndef FIPS_MODULE
# ifndef OPENSSL_NO_MDC2
    MD_CASE(mdc2)
# endif
# ifndef OPENSSL_NO_MD2
    MD_CASE(md2)
# endif
# ifndef OPENSSL_NO_MD4
    MD_CASE(md4)
# endif
# ifndef OPENSSL_NO_MD5
    MD_CASE(md5)
# endif
# ifndef OPENSSL_NO_RMD160
    MD_CASE(ripemd160)
# endif
#endif /* FIPS_MODULE */
    MD_CASE(sha1)
    MD_CASE(sha224)
    MD_CASE(sha256)
    MD_CASE(sha384)
    MD_CASE(sha512)
    MD_CASE(sha512_224)
    MD_CASE(sha512_256)
    MD_CASE(sha3_224)
    MD_CASE(sha3_256)
    MD_CASE(sha3_384)
    MD_CASE(sha3_512)
    default:
        return NULL;
    }
}